

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorspace.cpp
# Opt level: O2

void __thiscall
pbrt::RGBColorSpace::RGBColorSpace
          (RGBColorSpace *this,Point2f r,Point2f g,Point2f b,SpectrumHandle *illuminant,
          RGBToSpectrumTable *rgbToSpectrumTable,Allocator alloc)

{
  Tuple2<pbrt::Point2,_float> TVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  SquareMatrix<3> *m_00;
  SquareMatrix<3> *pSVar7;
  undefined1 auVar8 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar13 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar14 [64];
  undefined1 in_register_00001288 [56];
  undefined1 auVar15 [64];
  XYZ XVar16;
  XYZ XVar17;
  XYZ XVar18;
  SquareMatrix<3> m;
  undefined1 local_118 [16];
  undefined8 uStack_100;
  XYZ local_f0;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<3>),_alignof(pbrt::SquareMatrix<3>)> local_e0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [16];
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_88;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_80;
  undefined1 local_78 [16];
  Float local_68 [2];
  Float local_60;
  Float local_5c;
  Float local_58;
  SquareMatrix<3> local_4c;
  undefined1 auVar12 [56];
  
  auVar15._8_56_ = in_register_00001288;
  auVar15._0_8_ = b.super_Tuple2<pbrt::Point2,_float>;
  auVar14._8_56_ = in_register_00001248;
  auVar14._0_8_ = g.super_Tuple2<pbrt::Point2,_float>;
  auVar9._8_56_ = in_register_00001208;
  auVar9._0_8_ = r.super_Tuple2<pbrt::Point2,_float>;
  auVar3 = vmovlhps_avx(auVar9._0_16_,auVar14._0_16_);
  auVar12 = ZEXT856(auVar3._8_8_);
  local_98 = auVar15._0_16_;
  this->r = (Point2f)auVar3._0_8_;
  this->g = (Point2f)auVar3._8_8_;
  TVar1 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(local_98);
  (this->b).super_Tuple2<pbrt::Point2,_float> = TVar1;
  (this->w).super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)0x0;
  local_80.bits =
       (illuminant->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  DenselySampledSpectrum::DenselySampledSpectrum
            (&this->illuminant,(SpectrumHandle *)&local_80,alloc);
  pSVar7 = &this->XYZFromRGB;
  SquareMatrix<3>::SquareMatrix(pSVar7);
  SquareMatrix<3>::SquareMatrix(&this->RGBFromXYZ);
  this->rgbToSpectrumTable = rgbToSpectrumTable;
  local_88.bits =
       (illuminant->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  XVar16 = SpectrumToXYZ((SpectrumHandle *)&local_88);
  local_f0.Z = XVar16.Z;
  auVar10._0_8_ = XVar16._0_8_;
  auVar10._8_56_ = auVar12;
  auVar8 = auVar10._0_16_;
  auVar3 = vhaddps_avx(auVar8,auVar8);
  local_f0._0_8_ = vmovlps_avx(auVar8);
  fVar2 = local_f0.Z + auVar3._0_4_;
  auVar13._4_4_ = fVar2;
  auVar13._0_4_ = fVar2;
  auVar13._8_4_ = fVar2;
  auVar13._12_4_ = fVar2;
  auVar3 = vdivps_avx(auVar8,auVar13);
  TVar1 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar3);
  (this->w).super_Tuple2<pbrt::Point2,_float> = TVar1;
  uStack_100 = in_register_00001208._0_8_;
  XVar16 = XYZ::FromxyY(r,1.0);
  local_a8 = XVar16._0_8_;
  local_118._8_8_ = in_register_00001248._0_8_;
  uStack_a0 = uStack_100;
  XVar17 = XYZ::FromxyY(g,1.0);
  local_b8 = XVar17._0_8_;
  auVar12 = ZEXT856((ulong)local_98._8_8_);
  uStack_b0 = local_118._8_8_;
  XVar18 = XYZ::FromxyY((Point2f)local_98._0_8_,1.0);
  local_58 = XVar18.Z;
  auVar11._0_8_ = XVar18._0_8_;
  auVar11._8_56_ = auVar12;
  auVar3._8_8_ = uStack_a0;
  auVar3._0_8_ = local_a8;
  auVar8._8_8_ = uStack_b0;
  auVar8._0_8_ = local_b8;
  auVar3 = vmovlhps_avx(auVar3,auVar8);
  local_78 = vpermi2ps_avx512vl(_DAT_004967c0,auVar3,auVar11._0_16_);
  auVar3 = vinsertps_avx(auVar11._0_16_,auVar8,0x4c);
  local_118._8_8_ = auVar3._8_8_;
  local_68 = (Float  [2])vmovlps_avx(auVar3);
  local_60 = XVar16.Z;
  local_5c = XVar17.Z;
  Inverse<3>((optional<pbrt::SquareMatrix<3>_> *)&local_e0.__align,(SquareMatrix<3> *)local_78);
  m_00 = pstd::optional<pbrt::SquareMatrix<3>_>::value
                   ((optional<pbrt::SquareMatrix<3>_> *)&local_e0.__align);
  XVar16 = Mul<pbrt::XYZ,3,pbrt::XYZ>(m_00,&local_f0);
  local_118._0_8_ = XVar16._0_8_;
  pstd::optional<pbrt::SquareMatrix<3>_>::~optional
            ((optional<pbrt::SquareMatrix<3>_> *)&local_e0.__align);
  SquareMatrix<3>::SquareMatrix(&local_4c);
  local_4c.m[0][0] = XVar16.X;
  local_4c.m[1][1] = (Float)vextractps_avx(local_118,1);
  local_4c.m[2][2] = XVar16.Z;
  pbrt::operator*((SquareMatrix<3> *)&local_e0.__align,(SquareMatrix<3> *)local_78,&local_4c);
  (this->XYZFromRGB).m[2][2] = (Float)local_e0._32_4_;
  *(undefined8 *)pSVar7->m[0] = local_e0._0_8_;
  *(undefined8 *)((this->XYZFromRGB).m[0] + 2) = local_e0._8_8_;
  *(undefined8 *)((this->XYZFromRGB).m[1] + 1) = local_e0._16_8_;
  *(undefined8 *)(this->XYZFromRGB).m[2] = local_e0._24_8_;
  Inverse<3>((optional<pbrt::SquareMatrix<3>_> *)&local_e0.__align,pSVar7);
  pSVar7 = pstd::optional<pbrt::SquareMatrix<3>_>::value
                     ((optional<pbrt::SquareMatrix<3>_> *)&local_e0.__align);
  (this->RGBFromXYZ).m[2][2] = pSVar7->m[2][2];
  uVar4 = *(undefined8 *)(pSVar7->m[0] + 2);
  uVar5 = *(undefined8 *)(pSVar7->m[1] + 1);
  uVar6 = *(undefined8 *)pSVar7->m[2];
  *(undefined8 *)(this->RGBFromXYZ).m[0] = *(undefined8 *)pSVar7->m[0];
  *(undefined8 *)((this->RGBFromXYZ).m[0] + 2) = uVar4;
  *(undefined8 *)((this->RGBFromXYZ).m[1] + 1) = uVar5;
  *(undefined8 *)(this->RGBFromXYZ).m[2] = uVar6;
  pstd::optional<pbrt::SquareMatrix<3>_>::~optional
            ((optional<pbrt::SquareMatrix<3>_> *)&local_e0.__align);
  return;
}

Assistant:

RGBColorSpace::RGBColorSpace(Point2f r, Point2f g, Point2f b, SpectrumHandle illuminant,
                             const RGBToSpectrumTable *rgbToSpectrumTable,
                             Allocator alloc)
    : r(r),
      g(g),
      b(b),
      illuminant(illuminant, alloc),
      rgbToSpectrumTable(rgbToSpectrumTable) {
    // Compute whitepoint primaries
    XYZ W = SpectrumToXYZ(illuminant);
    w = W.xy();

    // Compute XYZ coordinates of primaries
    XYZ R = XYZ::FromxyY(r), G = XYZ::FromxyY(g), B = XYZ::FromxyY(b);

    // Compute _XYZFromRGB_ matrix for color space
    SquareMatrix<3> rgb(R.X, G.X, B.X, R.Y, G.Y, B.Y, R.Z, G.Z, B.Z);
    XYZ C = *Inverse(rgb) * W;
    XYZFromRGB = rgb * SquareMatrix<3>::Diag(C[0], C[1], C[2]);

    // Compute _RGBFromXYZ_ matrix for color space
    RGBFromXYZ = *Inverse(XYZFromRGB);
}